

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O3

int Ioa_WriteAigerEncode(uchar *pBuffer,int Pos,uint x)

{
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  
  if (x < 0x80) {
    uVar2 = (ulong)x;
  }
  else {
    pbVar3 = pBuffer + Pos;
    uVar2 = (ulong)x;
    do {
      *pbVar3 = (byte)x | 0x80;
      uVar2 = uVar2 >> 7;
      pbVar3 = pbVar3 + 1;
      Pos = Pos + 1;
      bVar1 = 0x3fff < x;
      x = (uint)uVar2;
    } while (bVar1);
  }
  pBuffer[Pos] = (uchar)uVar2;
  return Pos + 1;
}

Assistant:

int Ioa_WriteAigerEncode( unsigned char * pBuffer, int Pos, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
//        putc (ch, file);
        pBuffer[Pos++] = ch;
        x >>= 7;
    }
    ch = x;
//    putc (ch, file);
    pBuffer[Pos++] = ch;
    return Pos;
}